

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsMemoryStressCase.cpp
# Opt level: O3

void __thiscall deqp::gls::MemObjectAllocator::allocateBuffer(MemObjectAllocator *this,Random *rnd)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  uint in_EAX;
  deUint32 dVar5;
  GLenum GVar6;
  ulong uVar7;
  int size;
  pointer data;
  iterator __position;
  deUint32 buffer;
  undefined8 uStack_38;
  
  uStack_38 = (ulong)in_EAX;
  iVar3 = (this->m_config).minBufferSize;
  iVar4 = (this->m_config).maxBufferSize;
  dVar5 = deRandom_getUint32(&rnd->m_rnd);
  if (iVar4 != 0x7fffffff || iVar3 != -0x80000000) {
    dVar5 = dVar5 % ((iVar4 - iVar3) + 1U) + iVar3;
  }
  glwGenBuffers(1,(GLuint *)((long)&uStack_38 + 4));
  GVar6 = glwGetError();
  if (GVar6 != 0) {
    this->m_result = RESULT_GEN_BUFFERS_FAILED;
    goto LAB_00480e00;
  }
  glwBindBuffer(0x8892,uStack_38._4_4_);
  GVar6 = glwGetError();
  if (GVar6 == 0) {
    __position._M_current =
         (this->m_buffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    uVar7 = (long)__position._M_current -
            (long)(this->m_buffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    if ((uVar7 & 0x1fc) == 0) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
                (&this->m_buffers,((long)uVar7 >> 2) + 0x80);
      __position._M_current =
           (this->m_buffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_finish;
    }
    if (__position._M_current ==
        (this->m_buffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)this,__position,
                 (uint *)((long)&uStack_38 + 4));
    }
    else {
      *__position._M_current = uStack_38._4_4_;
      (this->m_buffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    if ((this->m_config).useDummyData == true) {
      data = (this->m_dummyData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    }
    else {
      data = (pointer)0x0;
    }
    glwBufferData(0x8892,(long)(int)dVar5,data,0x88e8);
    GVar6 = glwGetError();
    if (GVar6 != 0) {
      this->m_result = RESULT_BUFFER_DATA_FAILED;
      goto LAB_00480e00;
    }
    if ((this->m_config).write == true) {
      glwBufferSubData(0x8892,0,1,
                       (this->m_dummyData).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start);
    }
    GVar6 = glwGetError();
    if (GVar6 != 0) {
      this->m_result = RESULT_BUFFER_SUB_DATA_FAILED;
      goto LAB_00480e00;
    }
    if ((this->m_config).use == true) {
      BufferRenderer::render(&this->m_bufferRenderer,uStack_38._4_4_,size);
    }
    glwBindBuffer(0x8892,0);
    GVar6 = glwGetError();
    if (GVar6 == 0) {
      uVar1 = this->m_objectCount;
      uVar2 = this->m_bytesRequired;
      this->m_objectCount = uVar1 + 1;
      this->m_bytesRequired = dVar5 + uVar2;
      return;
    }
  }
  this->m_result = RESULT_BIND_BUFFER_FAILED;
LAB_00480e00:
  this->m_glError = GVar6;
  return;
}

Assistant:

void MemObjectAllocator::allocateBuffer (de::Random& rnd)
{
	const int	vectorBlockSize = 128;
	deUint32	buffer			= 0;
	deUint32	error			= 0;
	int			size			= rnd.getInt(m_config.minBufferSize, m_config.maxBufferSize);

	glGenBuffers(1, &buffer);
	error = glGetError();
	if (error != 0)
	{
		m_result	= RESULT_GEN_BUFFERS_FAILED;
		m_glError	= error;
		return;
	}

	glBindBuffer(GL_ARRAY_BUFFER, buffer);
	error = glGetError();
	if (error != 0)
	{
		m_result	= RESULT_BIND_BUFFER_FAILED;
		m_glError	= error;
		return;
	}

	if (m_buffers.size() % vectorBlockSize == 0)
		m_buffers.reserve(m_buffers.size() + vectorBlockSize);

	m_buffers.push_back(buffer);

	if (m_config.useDummyData)
	{
		DE_ASSERT((int)m_dummyData.size() >= size);
		glBufferData(GL_ARRAY_BUFFER, size, &(m_dummyData[0]), GL_DYNAMIC_DRAW);
	}
	else
		glBufferData(GL_ARRAY_BUFFER, size, NULL, GL_DYNAMIC_DRAW);

	error = glGetError();
	if (error != 0)
	{
		m_result	= RESULT_BUFFER_DATA_FAILED;
		m_glError	= error;
		return;
	}

	if (m_config.write)
		glBufferSubData(GL_ARRAY_BUFFER, 0, 1, &(m_dummyData[0]));

	error = glGetError();
	if (error != 0)
	{
		m_result	= RESULT_BUFFER_SUB_DATA_FAILED;
		m_glError	= error;
		return;
	}

	if (m_config.use)
	{
		try
		{
			m_bufferRenderer.render(buffer, size);
		}
		catch (const glu::Error& err)
		{
			m_result	= RESULT_RENDER_FAILED;
			m_glError	= err.getError();
			return;
		}
		catch (const glu::OutOfMemoryError&)
		{
			m_result	= RESULT_RENDER_FAILED;
			m_glError	= GL_OUT_OF_MEMORY;
			return;
		}
	}

	glBindBuffer(GL_ARRAY_BUFFER, 0);
	error = glGetError();
	if (error != 0)
	{
		m_result	= RESULT_BIND_BUFFER_FAILED;
		m_glError	= error;
		return;
	}

	m_objectCount++;
	m_bytesRequired += size;
}